

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testAttrOpaque(string *tempdir)

{
  exr_context_t f;
  char *in_stack_00000070;
  exr_context_t in_stack_00000250;
  exr_context_t local_10 [2];
  
  local_10[0] = createDummyFile(in_stack_00000070);
  testOpaqueHelper(in_stack_00000250);
  exr_finish(local_10);
  return;
}

Assistant:

void
testAttrOpaque (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testOpaqueHelper (NULL);
    exr_context_t f = createDummyFile ("<opaque>");
    testOpaqueHelper (f);
    exr_finish (&f);
}